

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::spacechar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  string_view in_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  undefined1 local_30 [8];
  LexCtx ctx;
  string_view in_local;
  
  in_00._M_str = (char *)in._M_len;
  in_00._M_len = (size_t)this;
  ctx.lexedSize = (size_t)this;
  LexCtx::LexCtx((LexCtx *)local_30,in_00);
  bVar2 = sv(" ",1);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar2);
  if (!bVar1) {
    bVar2 = sv("\n",1);
    bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar2);
    if (!bVar1) {
      bVar2 = sv("\r",1);
      bVar1 = LexCtx::takePrefix((LexCtx *)local_30,bVar2);
      if (!bVar1) {
        bVar2 = sv("\t",1);
        LexCtx::takePrefix((LexCtx *)local_30,bVar2);
      }
    }
  }
  LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> spacechar(std::string_view in) {
  LexCtx ctx(in);
  ctx.takePrefix(" "sv) || ctx.takePrefix("\n"sv) || ctx.takePrefix("\r"sv) ||
    ctx.takePrefix("\t"sv);
  return ctx.lexed();
}